

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line.cpp
# Opt level: O3

maybe<pstore::command_line::option_*,_void> *
pstore::command_line::details::find_handler
          (maybe<pstore::command_line::option_*,_void> *__return_storage_ptr__,string *name)

{
  _List_node_base *p_Var1;
  size_t __n;
  int iVar2;
  options_container *poVar3;
  string *psVar4;
  
  poVar3 = option::all_abi_cxx11_();
  for (p_Var1 = (poVar3->
                super__List_base<pstore::command_line::option_*,_std::allocator<pstore::command_line::option_*>_>
                )._M_impl._M_node.super__List_node_base._M_next; p_Var1 != (_List_node_base *)poVar3
      ; p_Var1 = (((_List_base<pstore::command_line::option_*,_std::allocator<pstore::command_line::option_*>_>
                    *)&p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next) {
    psVar4 = option::name_abi_cxx11_((option *)p_Var1[1]._M_next);
    __n = psVar4->_M_string_length;
    if ((__n == name->_M_string_length) &&
       ((__n == 0 ||
        (iVar2 = bcmp((psVar4->_M_dataplus)._M_p,(name->_M_dataplus)._M_p,__n), iVar2 == 0))))
    break;
  }
  if (p_Var1 == (_List_node_base *)poVar3) {
    *(undefined8 *)__return_storage_ptr__ = 0;
    __return_storage_ptr__->storage_ = (type)0x0;
  }
  else {
    __return_storage_ptr__->valid_ = true;
    __return_storage_ptr__->storage_ = (type)p_Var1[1]._M_next;
  }
  return __return_storage_ptr__;
}

Assistant:

maybe<option *> find_handler (std::string const & name) {
                    auto const & all_options = option::all ();
                    auto const end = std::end (all_options);
                    auto const it =
                        std::find_if (std::begin (all_options), end, [&name] (option * const opt) {
                            return opt->name () == name;
                        });
                    return it != end ? just (*it) : nothing<option *> ();
                }